

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenAtomicCmpxchg
          (BinaryenModuleRef module,BinaryenIndex bytes,BinaryenIndex offset,
          BinaryenExpressionRef ptr,BinaryenExpressionRef expected,BinaryenExpressionRef replacement
          ,BinaryenType type,char *memoryName)

{
  AtomicCmpxchg *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (AtomicCmpxchg *)MixedArena::allocSpace(&module->allocator,0x48,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = 0;
  this->replacement = (Expression *)0x0;
  (this->memory).super_IString.str._M_len = 0;
  *(undefined8 *)&this->bytes = 0;
  (this->offset).addr = 0;
  this->ptr = (Expression *)0x0;
  this->expected = (Expression *)0x0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression._id = AtomicCmpxchgId;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  this->bytes = (uint8_t)bytes;
  (this->offset).addr = (ulong)offset;
  this->ptr = ptr;
  this->expected = expected;
  this->replacement = replacement;
  (this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = type;
  wasm::AtomicCmpxchg::finalize(this);
  (this->memory).super_IString.str = sVar1;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicCmpxchg(BinaryenModuleRef module,
                                            BinaryenIndex bytes,
                                            BinaryenIndex offset,
                                            BinaryenExpressionRef ptr,
                                            BinaryenExpressionRef expected,
                                            BinaryenExpressionRef replacement,
                                            BinaryenType type,
                                            const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicCmpxchg(bytes,
                         offset,
                         (Expression*)ptr,
                         (Expression*)expected,
                         (Expression*)replacement,
                         Type(type),
                         getMemoryName(module, memoryName)));
}